

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_input_has_mouse_click_down_in_rect(nk_input *i,nk_buttons id,nk_rect b,nk_bool down)

{
  float fVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (i != (nk_input *)0x0) {
    fVar1 = (i->mouse).buttons[id].clicked_pos.x;
    if ((b.x <= fVar1) && (fVar1 < b.x + b.w)) {
      fVar1 = (i->mouse).buttons[id].clicked_pos.y;
      if ((b.y <= fVar1) && (fVar1 < b.y + b.h)) {
        uVar2 = (uint)((i->mouse).buttons[id].down == down);
      }
    }
  }
  return uVar2;
}

Assistant:

NK_API nk_bool
nk_input_has_mouse_click_down_in_rect(const struct nk_input *i, enum nk_buttons id,
struct nk_rect b, nk_bool down)
{
const struct nk_mouse_button *btn;
if (!i) return nk_false;
btn = &i->mouse.buttons[id];
return nk_input_has_mouse_click_in_rect(i, id, b) && (btn->down == down);
}